

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall TCMallocTest_AllTests_Test::TestBody(TCMallocTest_AllTests_Test *this)

{
  char cVar1;
  undefined4 uVar2;
  void *pvVar3;
  long lVar4;
  TestingPortal *pTVar5;
  long *plVar6;
  char *pcVar7;
  int s;
  size_t size;
  long lVar8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  double *this_00;
  AssertionResult *this_01;
  size_t i;
  ulong uVar10;
  bool bVar11;
  undefined8 uStack_c0;
  undefined1 local_b0 [8];
  AllocatorState rnd;
  size_t actual_p1_size;
  void *p2;
  undefined1 auStack_68 [8];
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  void *p1;
  overaligned_type *poveraligned;
  
  AllocatorState::AllocatorState((AllocatorState *)local_b0,100);
  puts("Testing empty allocation");
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AllocatorState::alloc((AllocatorState *)local_b0,0);
  actual_p1_size = 0;
  testing::internal::CmpHelperNE<void*,decltype(nullptr)>
            ((internal *)auStack_68,"p1","nullptr",&local_48._M_head_impl,(void **)&actual_p1_size);
  if (auStack_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&actual_p1_size);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&rnd.memalign_fraction_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
               ,0x520,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&rnd.memalign_fraction_,(Message *)&actual_p1_size);
LAB_00110a81:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&rnd.memalign_fraction_);
    plVar6 = (long *)actual_p1_size;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    actual_p1_size = (size_t)AllocatorState::alloc((AllocatorState *)local_b0,0);
    rnd.memalign_fraction_ = 0.0;
    testing::internal::CmpHelperNE<void*,decltype(nullptr)>
              ((internal *)auStack_68,"p2","nullptr",(void **)&actual_p1_size,
               (void **)&rnd.memalign_fraction_);
    if (auStack_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&rnd.memalign_fraction_);
      if (gtest_ar._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&p1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                 ,0x522,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&p1,(Message *)&rnd.memalign_fraction_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar);
      testing::internal::CmpHelperNE<void*,void*>
                ((internal *)auStack_68,"p1","p2",&local_48._M_head_impl,(void **)&actual_p1_size);
      if (auStack_68[0] != (internal)0x0) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar);
        free(local_48._M_head_impl);
        free((void *)actual_p1_size);
        puts("Testing STL use");
        auStack_68 = (undefined1  [8])0x0;
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        local_48._M_head_impl._0_4_ = 1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)&local_48);
        local_48._M_head_impl._0_4_ = 2;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)&local_48);
        local_48._M_head_impl._0_4_ = 3;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)&local_48);
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_48._M_head_impl._4_4_ << 0x20);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)&local_48);
        std::
        __stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (auStack_68,gtest_ar._0_8_);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)auStack_68);
        puts("Sanity-testing all the memory allocation functions");
        SetNewHook();
        SetDeleteHook();
        auStack_68 = (undefined1  [8])malloc;
        (*noopt_helper)(auStack_68);
        actual_p1_size = (*(code *)auStack_68)(10);
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                  ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                   &local_48._M_head_impl);
        if (auStack_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          if (gtest_ar._0_8_ == 0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&rnd.memalign_fraction_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                     ,0x554,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&rnd.memalign_fraction_,(Message *)&local_48);
          this_00 = &rnd.memalign_fraction_;
LAB_00110e40:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          _Var9._M_head_impl = local_48._M_head_impl;
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          rnd.memalign_fraction_ = (double)tc_malloc_size(actual_p1_size);
          local_48._M_head_impl._0_4_ = 10;
          testing::internal::CmpHelperGE<unsigned_long,int>
                    ((internal *)auStack_68,"actual_p1_size","10",
                     (unsigned_long *)&rnd.memalign_fraction_,(int *)&local_48);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x558,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
LAB_00110e3c:
            this_00 = (double *)&p1;
            goto LAB_00110e40;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          local_48._M_head_impl._0_4_ = 100000;
          testing::internal::CmpHelperLT<unsigned_long,int>
                    ((internal *)auStack_68,"actual_p1_size","100000",
                     (unsigned_long *)&rnd.memalign_fraction_,(int *)&local_48);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x559,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_68 = (undefined1  [8])malloc;
          (*noopt_helper)(auStack_68);
          actual_p1_size = (*(code *)auStack_68)(10);
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                     &local_48._M_head_impl);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x55e,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          tc_free_sized(actual_p1_size,10);
          VerifyDeleteHookWasCalled();
          auStack_68 = (undefined1  [8])tc_memalign;
          (*noopt_helper)(auStack_68);
          actual_p1_size = (*(code *)auStack_68)(1,10);
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                     &local_48._M_head_impl);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x566,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          tc_free_aligned_sized(actual_p1_size,1,10);
          VerifyDeleteHookWasCalled();
          actual_p1_size = tc_malloc_skip_new_handler(10);
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                     &local_48._M_head_impl);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x56c,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_68 = (undefined1  [8])calloc;
          (*noopt_helper)(auStack_68);
          actual_p1_size = (*(code *)auStack_68)(10,2);
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                     &local_48._M_head_impl);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x572,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          auStack_68 = (undefined1  [8])realloc;
          (*noopt_helper)(auStack_68);
          actual_p1_size = (*(code *)auStack_68)(actual_p1_size,30000);
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                     &local_48._M_head_impl);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x578,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          VerifyDeleteHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               PosixMemalign;
          (*noopt_helper)(&local_48);
          uVar2 = (*(code *)local_48._M_head_impl)(&actual_p1_size,8,0x28);
          p1 = (void *)CONCAT44(p1._4_4_,uVar2);
          local_48._M_head_impl = local_48._M_head_impl & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)auStack_68,"noopt(PosixMemalign)(&p1, sizeof(p1), 40)","0",
                     (int *)&p1,(int *)&local_48);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x57f,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                     &local_48._M_head_impl);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x580,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_68 = (undefined1  [8])Memalign;
          (*noopt_helper)(auStack_68);
          actual_p1_size = (*(code *)auStack_68)(0x10,0x32);
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                     &local_48._M_head_impl);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x586,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_68 = (undefined1  [8])valloc(0x3c);
          (*noopt_helper)(auStack_68);
          actual_p1_size = (size_t)auStack_68;
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                     &local_48._M_head_impl);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x596,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_68 = (undefined1  [8])pvalloc(0x46);
          (*noopt_helper)(auStack_68);
          actual_p1_size = (size_t)auStack_68;
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_68,"p1","nullptr",(void **)&actual_p1_size,
                     &local_48._M_head_impl);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x59c,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_48);
            goto LAB_00110e3c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_68 = (undefined1  [8])operator_new(1);
          (*noopt_helper)(auStack_68);
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_68
          ;
          p1 = (void *)0x0;
          testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                    ((internal *)auStack_68,"p2","nullptr",(char **)&local_48,&p1);
          if (auStack_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&p1);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&poveraligned,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x5a2,pcVar7);
            testing::internal::AssertHelper::operator=((AssertHelper *)&poveraligned,(Message *)&p1)
            ;
LAB_001110e3:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&poveraligned);
            _Var9._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)p1;
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar);
            VerifyNewHookWasCalled();
            operator_delete(local_48._M_head_impl,1);
            VerifyDeleteHookWasCalled();
            auStack_68 = (undefined1  [8])operator_new__(100);
            (*noopt_helper)(auStack_68);
            local_48._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_68;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_68,"p2","nullptr",(char **)&local_48,&p1);
            if (auStack_68[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (gtest_ar._0_8_ == 0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5a8,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_001110e3;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar);
            VerifyNewHookWasCalled();
            if (local_48._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              operator_delete__(local_48._M_head_impl);
            }
            VerifyDeleteHookWasCalled();
            auStack_68 = (undefined1  [8])operator_new(1,(nothrow_t *)&std::nothrow);
            (*noopt_helper)(auStack_68);
            local_48._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_68;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_68,"p2","nullptr",(char **)&local_48,&p1);
            if (auStack_68[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (gtest_ar._0_8_ == 0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5ae,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_001110e3;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar);
            VerifyNewHookWasCalled();
            operator_delete(local_48._M_head_impl,1);
            VerifyDeleteHookWasCalled();
            auStack_68 = (undefined1  [8])operator_new__(100,(nothrow_t *)&std::nothrow);
            (*noopt_helper)(auStack_68);
            local_48._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_68;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_68,"p2","nullptr",(char **)&local_48,&p1);
            if (auStack_68[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (gtest_ar._0_8_ == 0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5b4,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_001110e3;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar);
            VerifyNewHookWasCalled();
            if (local_48._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              operator_delete__(local_48._M_head_impl);
            }
            VerifyDeleteHookWasCalled();
            auStack_68 = (undefined1  [8])operator_new(100);
            (*noopt_helper)(auStack_68);
            local_48._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_68;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_68,"p2","nullptr",(char **)&local_48,&p1);
            if (auStack_68[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (gtest_ar._0_8_ == 0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5bb,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_001110e3;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar);
            VerifyNewHookWasCalled();
            operator_delete(local_48._M_head_impl);
            VerifyDeleteHookWasCalled();
            auStack_68 = (undefined1  [8])operator_new(100,(nothrow_t *)&std::nothrow);
            (*noopt_helper)(auStack_68);
            local_48._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_68;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_68,"p2","nullptr",(char **)&local_48,&p1);
            if (auStack_68[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (gtest_ar._0_8_ == 0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5c2,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_001110e3;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar);
            VerifyNewHookWasCalled();
            operator_delete(local_48._M_head_impl,(nothrow_t *)&std::nothrow);
            VerifyDeleteHookWasCalled();
            auStack_68 = (undefined1  [8])operator_new(0x80,0x40);
            (*noopt_helper)(auStack_68);
            p1 = (void *)auStack_68;
            poveraligned = (overaligned_type *)0x0;
            testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                      ((internal *)auStack_68,"poveraligned","nullptr",(overaligned_type **)&p1,
                       &poveraligned);
            if (auStack_68[0] == (internal)0x0) {
              testing::Message::Message((Message *)&poveraligned);
              if (gtest_ar._0_8_ == 0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&p2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5d6,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&p2,(Message *)&poveraligned);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&gtest_ar);
              poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
              p2._0_4_ = 0;
              testing::internal::CmpHelperEQ<unsigned_long,int>
                        ((internal *)auStack_68,"(((size_t)poveraligned) % kOveralignment)","0",
                         (unsigned_long *)&poveraligned,(int *)&p2);
              if (auStack_68[0] == (internal)0x0) {
                testing::Message::Message((Message *)&poveraligned);
                if (gtest_ar._0_8_ == 0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&p2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                           ,0x5d7,pcVar7);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&p2,(Message *)&poveraligned);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar);
                VerifyNewHookWasCalled();
                operator_delete(p1,0x80,0x40);
                VerifyDeleteHookWasCalled();
                auStack_68 = (undefined1  [8])operator_new__(0x500,0x40);
                (*noopt_helper)(auStack_68);
                p1 = (void *)auStack_68;
                poveraligned = (overaligned_type *)0x0;
                testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                          ((internal *)auStack_68,"poveraligned","nullptr",(overaligned_type **)&p1,
                           &poveraligned);
                if (auStack_68[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&poveraligned);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&p2,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                             ,0x5dd,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&p2,(Message *)&poveraligned);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&gtest_ar);
                  poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
                  p2._0_4_ = 0;
                  testing::internal::CmpHelperEQ<unsigned_long,int>
                            ((internal *)auStack_68,"(((size_t)poveraligned) % kOveralignment)","0",
                             (unsigned_long *)&poveraligned,(int *)&p2);
                  if (auStack_68[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&poveraligned);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p2,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                               ,0x5de,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p2,(Message *)&poveraligned);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&gtest_ar);
                    VerifyNewHookWasCalled();
                    if (p1 != (void *)0x0) {
                      operator_delete__(p1,0x40);
                    }
                    VerifyDeleteHookWasCalled();
                    auStack_68 = (undefined1  [8])operator_new(0x80,0x40,(nothrow_t *)&std::nothrow)
                    ;
                    (*noopt_helper)(auStack_68);
                    p1 = (void *)auStack_68;
                    poveraligned = (overaligned_type *)0x0;
                    testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                              ((internal *)auStack_68,"poveraligned","nullptr",
                               (overaligned_type **)&p1,&poveraligned);
                    if (auStack_68[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&poveraligned);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar7 = "";
                      }
                      else {
                        pcVar7 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&p2,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                 ,0x5e4,pcVar7);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&p2,(Message *)&poveraligned);
                    }
                    else {
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&gtest_ar);
                      poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
                      p2._0_4_ = 0;
                      testing::internal::CmpHelperEQ<unsigned_long,int>
                                ((internal *)auStack_68,"(((size_t)poveraligned) % kOveralignment)",
                                 "0",(unsigned_long *)&poveraligned,(int *)&p2);
                      if (auStack_68[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&poveraligned);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar7 = "";
                        }
                        else {
                          pcVar7 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&p2,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                   ,0x5e5,pcVar7);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&p2,(Message *)&poveraligned);
                      }
                      else {
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&gtest_ar);
                        VerifyNewHookWasCalled();
                        operator_delete(p1,0x80,0x40);
                        VerifyDeleteHookWasCalled();
                        auStack_68 = (undefined1  [8])
                                     operator_new__(0x500,0x40,(nothrow_t *)&std::nothrow);
                        (*noopt_helper)(auStack_68);
                        p1 = (void *)auStack_68;
                        poveraligned = (overaligned_type *)0x0;
                        testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                                  ((internal *)auStack_68,"poveraligned","nullptr",
                                   (overaligned_type **)&p1,&poveraligned);
                        if (auStack_68[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&poveraligned);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar7 = "";
                          }
                          else {
                            pcVar7 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&p2,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                     ,0x5eb,pcVar7);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&p2,(Message *)&poveraligned);
                        }
                        else {
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&gtest_ar);
                          poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
                          p2._0_4_ = 0;
                          testing::internal::CmpHelperEQ<unsigned_long,int>
                                    ((internal *)auStack_68,
                                     "(((size_t)poveraligned) % kOveralignment)","0",
                                     (unsigned_long *)&poveraligned,(int *)&p2);
                          if (auStack_68[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&poveraligned);
                            if (gtest_ar._0_8_ == 0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = *(char **)gtest_ar._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&p2,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                       ,0x5ec,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&p2,(Message *)&poveraligned);
                          }
                          else {
                            std::
                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&gtest_ar);
                            VerifyNewHookWasCalled();
                            if (p1 != (void *)0x0) {
                              operator_delete__(p1,0x40);
                            }
                            VerifyDeleteHookWasCalled();
                            auStack_68 = (undefined1  [8])operator_new(100,0x40);
                            (*noopt_helper)(auStack_68);
                            local_48._M_head_impl =
                                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)auStack_68;
                            poveraligned = (overaligned_type *)0x0;
                            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                                      ((internal *)auStack_68,"p2","nullptr",(char **)&local_48,
                                       &poveraligned);
                            if (auStack_68[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&poveraligned);
                              if (gtest_ar._0_8_ == 0) {
                                pcVar7 = "";
                              }
                              else {
                                pcVar7 = *(char **)gtest_ar._0_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&p2,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                         ,0x5f3,pcVar7);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&p2,(Message *)&poveraligned);
                            }
                            else {
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar);
                              poveraligned = (overaligned_type *)
                                             (ulong)((uint)local_48._M_head_impl & 0x3f);
                              p2._0_4_ = 0;
                              testing::internal::CmpHelperEQ<unsigned_long,int>
                                        ((internal *)auStack_68,"(((size_t)p2) % kOveralignment)",
                                         "0",(unsigned_long *)&poveraligned,(int *)&p2);
                              if (auStack_68[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&poveraligned);
                                if (gtest_ar._0_8_ == 0) {
                                  pcVar7 = "";
                                }
                                else {
                                  pcVar7 = *(char **)gtest_ar._0_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&p2,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                           ,0x5f4,pcVar7);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&p2,(Message *)&poveraligned);
                              }
                              else {
                                std::
                                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&gtest_ar);
                                VerifyNewHookWasCalled();
                                operator_delete(local_48._M_head_impl,0x40);
                                VerifyDeleteHookWasCalled();
                                lVar8 = 100;
                                auStack_68 = (undefined1  [8])
                                             operator_new(100,0x40,(nothrow_t *)&std::nothrow);
                                (*noopt_helper)(auStack_68);
                                local_48._M_head_impl =
                                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)auStack_68;
                                poveraligned = (overaligned_type *)0x0;
                                testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                                          ((internal *)auStack_68,"p2","nullptr",(char **)&local_48,
                                           &poveraligned);
                                if (auStack_68[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&poveraligned);
                                  if (gtest_ar._0_8_ == 0) {
                                    pcVar7 = "";
                                  }
                                  else {
                                    pcVar7 = *(char **)gtest_ar._0_8_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&p2,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                             ,0x5fa,pcVar7);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&p2,(Message *)&poveraligned);
                                }
                                else {
                                  std::
                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&gtest_ar);
                                  poveraligned = (overaligned_type *)
                                                 (ulong)((uint)local_48._M_head_impl & 0x3f);
                                  p2._0_4_ = 0;
                                  testing::internal::CmpHelperEQ<unsigned_long,int>
                                            ((internal *)auStack_68,
                                             "(((size_t)p2) % kOveralignment)","0",
                                             (unsigned_long *)&poveraligned,(int *)&p2);
                                  if (auStack_68[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&poveraligned);
                                    if (gtest_ar._0_8_ == 0) {
                                      pcVar7 = "";
                                    }
                                    else {
                                      pcVar7 = *(char **)gtest_ar._0_8_;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&p2,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                               ,0x5fb,pcVar7);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&p2,(Message *)&poveraligned);
                                  }
                                  else {
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar);
                                    VerifyNewHookWasCalled();
                                    operator_delete(local_48._M_head_impl,0x40,
                                                    (nothrow_t *)&std::nothrow);
                                    VerifyDeleteHookWasCalled();
                                    auStack_68 = (undefined1  [8])operator_new(0x80,0x40);
                                    (*noopt_helper)(auStack_68);
                                    p1 = (void *)auStack_68;
                                    poveraligned = (overaligned_type *)0x0;
                                    testing::internal::
                                    CmpHelperNE<overaligned_type*,decltype(nullptr)>
                                              ((internal *)auStack_68,"poveraligned","nullptr",
                                               (overaligned_type **)&p1,&poveraligned);
                                    if (auStack_68[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&poveraligned);
                                      if (gtest_ar._0_8_ == 0) {
                                        pcVar7 = "";
                                      }
                                      else {
                                        pcVar7 = *(char **)gtest_ar._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&p2,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                 ,0x601,pcVar7);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&p2,(Message *)&poveraligned);
                                    }
                                    else {
                                      std::
                                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar);
                                      poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
                                      p2._0_4_ = 0;
                                      testing::internal::CmpHelperEQ<unsigned_long,int>
                                                ((internal *)auStack_68,
                                                 "(((size_t)poveraligned) % kOveralignment)","0",
                                                 (unsigned_long *)&poveraligned,(int *)&p2);
                                      if (auStack_68[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&poveraligned);
                                        if (gtest_ar._0_8_ == 0) {
                                          pcVar7 = "";
                                        }
                                        else {
                                          pcVar7 = *(char **)gtest_ar._0_8_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&p2,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x602,pcVar7);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&p2,(Message *)&poveraligned);
                                      }
                                      else {
                                        std::
                                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar);
                                        VerifyNewHookWasCalled();
                                        operator_delete(p1,0x80,0x40);
                                        VerifyDeleteHookWasCalled();
                                        auStack_68 = (undefined1  [8])operator_new__(0x500,0x40);
                                        (*noopt_helper)(auStack_68);
                                        p1 = (void *)auStack_68;
                                        poveraligned = (overaligned_type *)0x0;
                                        testing::internal::
                                        CmpHelperNE<overaligned_type*,decltype(nullptr)>
                                                  ((internal *)auStack_68,"poveraligned","nullptr",
                                                   (overaligned_type **)&p1,&poveraligned);
                                        if (auStack_68[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)&poveraligned);
                                          if (gtest_ar._0_8_ == 0) {
                                            pcVar7 = "";
                                          }
                                          else {
                                            pcVar7 = *(char **)gtest_ar._0_8_;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&p2,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x608,pcVar7);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&p2,(Message *)&poveraligned);
                                        }
                                        else {
                                          std::
                                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar);
                                          poveraligned = (overaligned_type *)
                                                         (ulong)((uint)p1 & 0x3f);
                                          p2._0_4_ = 0;
                                          testing::internal::CmpHelperEQ<unsigned_long,int>
                                                    ((internal *)auStack_68,
                                                     "(((size_t)poveraligned) % kOveralignment)","0"
                                                     ,(unsigned_long *)&poveraligned,(int *)&p2);
                                          if (auStack_68[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)&poveraligned);
                                            if (gtest_ar._0_8_ == 0) {
                                              pcVar7 = "";
                                            }
                                            else {
                                              pcVar7 = *(char **)gtest_ar._0_8_;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&p2,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x609,pcVar7);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&p2,(Message *)&poveraligned)
                                            ;
                                          }
                                          else {
                                            std::
                                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar);
                                            VerifyNewHookWasCalled();
                                            operator_delete__(p1,0x500,0x40);
                                            VerifyDeleteHookWasCalled();
                                            auStack_68 = (undefined1  [8])
                                                         strdup("in memory of James Golick");
                                            (*noopt_helper)(auStack_68);
                                            local_48._M_head_impl =
                                                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auStack_68;
                                            poveraligned = (overaligned_type *)0x0;
                                            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                                                      ((internal *)auStack_68,"p2","nullptr",
                                                       (char **)&local_48,&poveraligned);
                                            if (auStack_68[0] != (internal)0x0) {
                                              std::
                                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar);
                                              VerifyNewHookWasCalled();
                                              _Var9._M_head_impl = local_48._M_head_impl;
                                              free(local_48._M_head_impl);
                                              VerifyDeleteHookWasCalled();
                                              tcmalloc::
                                              Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1356:30)>
                                              ::~Cleanup((
                                                  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:1356:30)>
                                                  *)_Var9._M_head_impl);
                                              puts("Testing large allocation");
                                              local_48._M_head_impl =
                                                   (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)AllocatorState::alloc
                                                              ((AllocatorState *)local_b0,0x6400000)
                                              ;
                                              actual_p1_size = 0;
                                              testing::internal::
                                              CmpHelperNE<void*,decltype(nullptr)>
                                                        ((internal *)auStack_68,"p","nullptr",
                                                         &local_48._M_head_impl,
                                                         (void **)&actual_p1_size);
                                              if (auStack_68[0] != (internal)0x0) {
                                                std::
                                                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar);
                                                free(local_48._M_head_impl);
                                                puts("Testing calloc");
                                                TestCalloc(0,0,true);
                                                TestCalloc(0,1,true);
                                                TestCalloc(1,1,true);
                                                TestCalloc(0x400,0,true);
                                                TestCalloc(0x100000,0,true);
                                                TestCalloc(0,0x400,true);
                                                TestCalloc(0,0x100000,true);
                                                TestCalloc(0x100000,2,true);
                                                TestCalloc(2,0x100000,true);
                                                TestCalloc(1000,1000,true);
                                                TestCalloc(0xffffffffffffffff,2,false);
                                                TestCalloc(2,0xffffffffffffffff,false);
                                                TestCalloc(0xffffffffffffffff,0xffffffffffffffff,
                                                           false);
                                                TestCalloc(0x7fffffffffffffff,3,false);
                                                TestCalloc(3,0x7fffffffffffffff,false);
                                                TestCalloc(0x7fffffffffffffff,0x7fffffffffffffff,
                                                           false);
                                                puts("Testing huge allocations");
                                                for (uVar10 = 0; uVar10 < 70000;
                                                    uVar10 = uVar10 + lVar4 % 0x14) {
                                                  auStack_68 = (undefined1  [8])~uVar10;
                                                  (*noopt_helper)(auStack_68);
                                                  pvVar3 = AllocatorState::alloc
                                                                     ((AllocatorState *)local_b0,
                                                                      (size_t)auStack_68);
                                                  if (pvVar3 != (void *)0x0) {
                                                    pcVar7 = "Check failed: p == nullptr\n";
                                                    uStack_c0 = 0x1b;
                                                    goto LAB_0011172b;
                                                  }
                                                  lVar4 = random();
                                                }
                                                pTVar5 = tcmalloc::TestingPortal::Get();
                                                cVar1 = (**(code **)(*(long *)pTVar5 + 8))(pTVar5);
                                                if (cVar1 == '\0') {
                                                  uVar10 = 0;
                                                  while (bVar11 = lVar8 != 0, lVar8 = lVar8 + -1,
                                                        bVar11) {
                                                    pvVar3 = AllocatorState::alloc
                                                                       ((AllocatorState *)local_b0,
                                                                        uVar10 + 0x7fffffffffffffff)
                                                    ;
                                                    free(pvVar3);
                                                    pvVar3 = AllocatorState::alloc
                                                                       ((AllocatorState *)local_b0,
                                                                        uVar10 ^ 0x7fffffffffffffff)
                                                    ;
                                                    free(pvVar3);
                                                    uVar10 = uVar10 + 1;
                                                  }
                                                }
                                                plVar6 = (long *)MallocExtension::instance();
                                                if (plVar6 == (long *)0x0) {
                                                  pcVar7 = "Check failed: inst\n";
                                                  uStack_c0 = 0x13;
LAB_0011172b:
                                                  syscall(1,2,pcVar7,uStack_c0);
                                                  abort();
                                                }
                                                (**(code **)(*plVar6 + 0x90))(plVar6);
                                                pTVar5 = tcmalloc::TestingPortal::Get();
                                                cVar1 = (**(code **)(*(long *)pTVar5 + 8))(pTVar5);
                                                if (cVar1 == '\0') {
                                                  local_48._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x13a4f3;
                                                  puts("Testing out of memory");
                                                  anon_unknown.dwarf_194d9::NumericProperty::
                                                  Override((NumericProperty *)auStack_68,
                                                           (size_t)&local_48);
                                                  size = 0;
                                                  while (pvVar3 = AllocatorState::alloc
                                                                            ((AllocatorState *)
                                                                             local_b0,size),
                                                        pvVar3 != (void *)0x0) {
                                                    free(pvVar3);
                                                    size = size + 0xa00000;
                                                  }
                                                  tcmalloc::
                                                  Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:151:30)>
                                                  ::~Cleanup((
                                                  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:151:30)>
                                                  *)auStack_68);
                                                }
                                                goto LAB_00110b4a;
                                              }
                                              testing::Message::Message((Message *)&actual_p1_size);
                                              if (gtest_ar._0_8_ == 0) {
                                                pcVar7 = "";
                                              }
                                              else {
                                                pcVar7 = *(char **)gtest_ar._0_8_;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&rnd.memalign_fraction_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x621,pcVar7);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&rnd.memalign_fraction_,
                                                         (Message *)&actual_p1_size);
                                              goto LAB_00110a81;
                                            }
                                            testing::Message::Message((Message *)&poveraligned);
                                            if (gtest_ar._0_8_ == 0) {
                                              pcVar7 = "";
                                            }
                                            else {
                                              pcVar7 = *(char **)gtest_ar._0_8_;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&p2,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x615,pcVar7);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&p2,(Message *)&poveraligned)
                                            ;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p2);
            _Var9._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 poveraligned;
          }
        }
        this_01 = &gtest_ar;
        if (_Var9._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)_Var9._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_01);
        tcmalloc::
        Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1356:30)>
        ::~Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:1356:30)>
                    *)this_01);
        goto LAB_00110b4a;
      }
      testing::Message::Message((Message *)&rnd.memalign_fraction_);
      if (gtest_ar._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&p1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                 ,0x523,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&p1,(Message *)&rnd.memalign_fraction_);
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p1);
    plVar6 = (long *)rnd.memalign_fraction_;
  }
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
LAB_00110b4a:
  std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::~vector
            ((vector<TestHarness::Type,_std::allocator<TestHarness::Type>_> *)&rnd);
  return;
}

Assistant:

TEST(TCMallocTest, AllTests) {
  AllocatorState rnd(100);

  // Check that empty allocation works
  printf("Testing empty allocation\n");
  {
    void* p1 = rnd.alloc(0);
    ASSERT_NE(p1, nullptr);
    void* p2 = rnd.alloc(0);
    ASSERT_NE(p2, nullptr);
    ASSERT_NE(p1, p2);
    free(p1);
    free(p2);
  }

  // This code stresses some of the memory allocation via STL.
  // It may call operator delete(void*, nothrow_t).
  printf("Testing STL use\n");
  {
    std::vector<int> v;
    v.push_back(1);
    v.push_back(2);
    v.push_back(3);
    v.push_back(0);
    std::stable_sort(v.begin(), v.end());
  }

#ifdef ENABLE_SIZED_DELETE
  {
    printf("Testing large sized delete is not crashing\n");
    // Large sized delete
    // case. https://github.com/gperftools/gperftools/issues/1254
    std::vector<char*> addresses;
    constexpr int kSizedDepth = 1024;
    addresses.reserve(kSizedDepth);
    for (int i = 0; i < kSizedDepth; i++) {
      addresses.push_back(noopt(new char[12686]));
    }
    for (int i = 0; i < kSizedDepth; i++) {
      ::operator delete[](addresses[i], 12686);
    }
  }
#endif

  // Test each of the memory-allocation functions once, just as a sanity-check
  printf("Sanity-testing all the memory allocation functions\n");
  {
    // We use new-hook and delete-hook to verify we actually called the
    // tcmalloc version of these routines, and not the libc version.
    SetNewHook();      // defined as part of MAKE_HOOK_CALLBACK, above
    SetDeleteHook();   // ditto
    tcmalloc::Cleanup unhook([] () {
      // Reset the hooks to what they used to be.  These are all
      // defined as part of MAKE_HOOK_CALLBACK, above.
      ResetNewHook();
      ResetDeleteHook();
    });

    void* p1 = noopt(malloc)(10);
    ASSERT_NE(p1, nullptr);    // force use of this variable
    VerifyNewHookWasCalled();
    // Also test the non-standard tc_malloc_size
    size_t actual_p1_size = tc_malloc_size(p1);
    ASSERT_GE(actual_p1_size, 10);
    ASSERT_LT(actual_p1_size, 100000);   // a reasonable upper-bound, I think
    free(p1);
    VerifyDeleteHookWasCalled();

    p1 = noopt(malloc)(10);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    tc_free_sized(p1, 10);
    VerifyDeleteHookWasCalled();

    // sadly windows stuff lacks aligned_alloc
    // (https://learn.microsoft.com/en-us/cpp/standard-library/cstdlib?view=msvc-170#remarks-6)
    p1 = noopt(tc_memalign)(1, 10);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    tc_free_aligned_sized(p1, 1, 10);
    VerifyDeleteHookWasCalled();

    p1 = tc_malloc_skip_new_handler(10);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    p1 = noopt(calloc)(10, 2);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    // We make sure we realloc to a big size, since some systems (OS
    // X) will notice if the realloced size continues to fit into the
    // malloc-block and make this a noop if so.
    p1 = noopt(realloc)(p1, 30000);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    VerifyDeleteHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    if (kOSSupportsMemalign) {
      ASSERT_EQ(noopt(PosixMemalign)(&p1, sizeof(p1), 40), 0);
      ASSERT_NE(p1, nullptr);
      VerifyNewHookWasCalled();
      free(p1);
      VerifyDeleteHookWasCalled();

      p1 = noopt(Memalign)(sizeof(p1) * 2, 50);
      ASSERT_NE(p1, nullptr);
      VerifyNewHookWasCalled();
      free(p1);
      VerifyDeleteHookWasCalled();
    }

    // Windows has _aligned_malloc.  Let's test that that's captured too.
#if (defined(_MSC_VER) || defined(__MINGW32__)) && !defined(PERFTOOLS_NO_ALIGNED_MALLOC)
    p1 = noopt(_aligned_malloc)(sizeof(p1) * 2, 64);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    _aligned_free(p1);
    VerifyDeleteHookWasCalled();
#endif

    p1 = noopt(valloc(60));
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    p1 = noopt(pvalloc(70));
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    char* p2 = noopt(new char);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete p2;
    VerifyDeleteHookWasCalled();

    p2 = noopt(new char[100]);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete[] p2;
    VerifyDeleteHookWasCalled();

    p2 = noopt(new (std::nothrow) char);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete p2;
    VerifyDeleteHookWasCalled();

    p2 = noopt(new (std::nothrow) char[100]);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete[] p2;
    VerifyDeleteHookWasCalled();

    // Another way of calling operator new
    p2 = noopt(static_cast<char*>(::operator new(100)));
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete(p2);
    VerifyDeleteHookWasCalled();

    // Try to call nothrow's delete too.  Compilers use this.
    p2 = noopt(static_cast<char*>(::operator new(100, std::nothrow)));
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete(p2, std::nothrow);
    VerifyDeleteHookWasCalled();

#ifdef ENABLE_SIZED_DELETE
    p2 = noopt(new char);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete(p2, sizeof(char));
    VerifyDeleteHookWasCalled();

    p2 = noopt(new char[100]);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete[](p2, sizeof(char) * 100);
    VerifyDeleteHookWasCalled();
#endif

    overaligned_type* poveraligned = noopt(new overaligned_type);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete poveraligned;
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new overaligned_type[10]);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete[] poveraligned;
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new(std::nothrow) overaligned_type);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete poveraligned;
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new(std::nothrow) overaligned_type[10]);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete[] poveraligned;
    VerifyDeleteHookWasCalled();

    // Another way of calling operator new
    p2 = noopt(static_cast<char*>(::operator new(100, std::align_val_t(kOveralignment))));
    ASSERT_NE(p2, nullptr);
    ASSERT_EQ((((size_t)p2) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete(p2, std::align_val_t(kOveralignment));
    VerifyDeleteHookWasCalled();

    p2 = noopt(static_cast<char*>(::operator new(100, std::align_val_t(kOveralignment), std::nothrow)));
    ASSERT_NE(p2, nullptr);
    ASSERT_EQ((((size_t)p2) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete(p2, std::align_val_t(kOveralignment), std::nothrow);
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new overaligned_type);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete(poveraligned, sizeof(overaligned_type), std::align_val_t(kOveralignment));
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new overaligned_type[10]);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete[](poveraligned, sizeof(overaligned_type) * 10, std::align_val_t(kOveralignment));
    VerifyDeleteHookWasCalled();

// On AIX user defined malloc replacement of libc routines
// cannot be done at link time must be done a runtime via
// environment variable MALLOCTYPE
#if !defined(_AIX)
    // Try strdup(), which the system allocates but we must free.  If
    // all goes well, libc will use our malloc!
    p2 = noopt(strdup("in memory of James Golick"));
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    free(p2);
    VerifyDeleteHookWasCalled();
#endif
  }

  // Check that "lots" of memory can be allocated
  printf("Testing large allocation\n");
  {
    const int mb_to_allocate = 100;
    void* p = rnd.alloc(mb_to_allocate << 20);
    ASSERT_NE(p, nullptr);  // could not allocate
    free(p);
  }

  // Check calloc() with various arguments
  printf("Testing calloc\n");
  TestCalloc(0, 0, true);
  TestCalloc(0, 1, true);
  TestCalloc(1, 1, true);
  TestCalloc(1<<10, 0, true);
  TestCalloc(1<<20, 0, true);
  TestCalloc(0, 1<<10, true);
  TestCalloc(0, 1<<20, true);
  TestCalloc(1<<20, 2, true);
  TestCalloc(2, 1<<20, true);
  TestCalloc(1000, 1000, true);

  TestCalloc(kMaxSize, 2, false);
  TestCalloc(2, kMaxSize, false);
  TestCalloc(kMaxSize, kMaxSize, false);

  TestCalloc(kMaxSignedSize, 3, false);
  TestCalloc(3, kMaxSignedSize, false);
  TestCalloc(kMaxSignedSize, kMaxSignedSize, false);

  // Do the memory intensive tests after threads are done, since exhausting
  // the available address space can make pthread_create to fail.

  // Check that huge allocations fail with nullptr instead of crashing
  printf("Testing huge allocations\n");
  TestHugeAllocations(&rnd);

  // Check that large allocations fail with nullptr instead of crashing
  //
  // debug allocation takes forever for huge allocs
  if (!TestingPortal::Get()->IsDebuggingMalloc()) {
    constexpr NumericProperty kHeapLimitMB{"tcmalloc.heap_limit_mb"};
    printf("Testing out of memory\n");
    tcmalloc::Cleanup cleanup_limit = kHeapLimitMB.Override(1<<10); // 1 gig. Note, this is in megs.
    // Don't exercise more than 1 gig, no need to.
    for (int s = 0; ; s += (10<<20)) {
      void* large_object = rnd.alloc(s);
      if (large_object == nullptr) {
        break;
      }
      free(large_object);
    }
  }
}